

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate_data.cc
# Opt level: O3

void __thiscall re2c::Skeleton::emit_data(Skeleton *this,char *fname)

{
  long *plVar1;
  FILE *__stream;
  FILE *__stream_00;
  long *plVar2;
  string keys_name;
  string input_name;
  allocator<char> local_d1;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50 [2];
  long local_40 [2];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,fname,(allocator<char> *)local_50);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_90);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_a0 = *plVar2;
    lStack_98 = plVar1[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar2;
    local_b0 = (long *)*plVar1;
  }
  local_a8 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_b0,(ulong)(this->name)._M_dataplus._M_p);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_c0 = *plVar2;
    lStack_b8 = plVar1[3];
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *plVar2;
    local_d0 = (long *)*plVar1;
  }
  local_c8 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_d0);
  local_70 = &local_60;
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_60 = *plVar2;
    lStack_58 = plVar1[3];
  }
  else {
    local_60 = *plVar2;
    local_70 = (long *)*plVar1;
  }
  local_68 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  __stream = fopen((char *)local_70,"wb");
  if (__stream == (FILE *)0x0) {
    error("cannot open file: %s",local_70);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)local_50,fname,&local_d1);
    plVar1 = (long *)std::__cxx11::string::append((char *)local_50);
    plVar2 = plVar1 + 2;
    if ((long *)*plVar1 == plVar2) {
      local_80 = *plVar2;
      lStack_78 = plVar1[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar2;
      local_90 = (long *)*plVar1;
    }
    local_88 = plVar1[1];
    *plVar1 = (long)plVar2;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    plVar1 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_90,(ulong)(this->name)._M_dataplus._M_p);
    plVar2 = plVar1 + 2;
    if ((long *)*plVar1 == plVar2) {
      local_a0 = *plVar2;
      lStack_98 = plVar1[3];
      local_b0 = &local_a0;
    }
    else {
      local_a0 = *plVar2;
      local_b0 = (long *)*plVar1;
    }
    local_a8 = plVar1[1];
    *plVar1 = (long)plVar2;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_b0);
    plVar2 = plVar1 + 2;
    if ((long *)*plVar1 == plVar2) {
      local_c0 = *plVar2;
      lStack_b8 = plVar1[3];
      local_d0 = &local_c0;
    }
    else {
      local_c0 = *plVar2;
      local_d0 = (long *)*plVar1;
    }
    local_c8 = plVar1[1];
    *plVar1 = (long)plVar2;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    if (local_b0 != &local_a0) {
      operator_delete(local_b0,local_a0 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    __stream_00 = fopen((char *)local_d0,"wb");
    if (__stream_00 != (FILE *)0x0) {
      generate_paths(this,(FILE *)__stream,(FILE *)__stream_00);
      fclose(__stream);
      fclose(__stream_00);
      if (local_d0 != &local_c0) {
        operator_delete(local_d0,local_c0 + 1);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70,local_60 + 1);
      }
      return;
    }
    error("cannot open file: %s",local_d0);
  }
  exit(1);
}

Assistant:

void Skeleton::emit_data (const char * fname)
{
	const std::string input_name = std::string (fname) + "." + name + ".input";
	FILE * input = fopen (input_name.c_str (), "wb");
	if (!input)
	{
		error ("cannot open file: %s", input_name.c_str ());
		exit (1);
	}
	const std::string keys_name = std::string (fname) + "." + name + ".keys";
	FILE * keys = fopen (keys_name.c_str (), "wb");
	if (!keys)
	{
		error ("cannot open file: %s", keys_name.c_str ());
		exit (1);
	}

	generate_paths (input, keys);

	fclose (input);
	fclose (keys);
}